

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::initializeLater(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  tm *__tp;
  time_t tVar5;
  tm *t;
  time_t now;
  int local_a8;
  int following;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string token;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  token.field_2._8_8_ = Pig::cursor(pig);
  std::__cxx11::string::string((string *)local_48);
  std::allocator<char>::allocator();
  following._2_1_ = 0;
  following._1_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"later",&local_69);
  bVar1 = Pig::skipPartial(pig,&local_68,(string *)local_48,false);
  if (bVar1) {
    uVar3 = std::__cxx11::string::length();
    bVar1 = true;
    if (uVar3 < (ulong)(long)minimumMatchLength) goto LAB_00112b84;
  }
  else {
LAB_00112b84:
    std::allocator<char>::allocator();
    following._2_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"someday",(allocator<char> *)((long)&following + 3));
    following._1_1_ = 1;
    bVar2 = Pig::skipPartial(pig,&local_a0,(string *)local_48,false);
    bVar1 = false;
    if (bVar2) {
      uVar3 = std::__cxx11::string::length();
      local_a8 = 4;
      piVar4 = std::max<int>(&minimumMatchLength,&local_a8);
      bVar1 = (ulong)(long)*piVar4 <= uVar3;
    }
  }
  if ((following._1_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((following._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&following + 3));
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar1) {
    now._4_4_ = Pig::peek(pig);
    bVar1 = unicodeLatinAlpha(now._4_4_);
    if ((!bVar1) && (bVar1 = unicodeLatinDigit(now._4_4_), !bVar1)) {
      t = (tm *)time((time_t *)0x0);
      __tp = localtime((time_t *)&t);
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_year = 0x1fa3;
      __tp->tm_mon = 0xb;
      __tp->tm_mday = 0x1e;
      __tp->tm_isdst = -1;
      tVar5 = mktime(__tp);
      this->_date = tVar5;
      this_local._7_1_ = true;
      goto LAB_00112e79;
    }
  }
  Pig::restoreTo(pig,token.field_2._8_8_);
  this_local._7_1_ = false;
LAB_00112e79:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Datetime::initializeLater (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if ((pig.skipPartial ("later", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))

      ||

     (pig.skipPartial ("someday", token) &&
      token.length () >= static_cast <std::string::size_type> (std::max (Datetime::minimumMatchLength, 4))))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_year = 8099;  // Year 9999
      t->tm_mon = 11;
      t->tm_mday = 30;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}